

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putRGBcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint16_t *wp;
  
  if (h != 0) {
    uVar1 = img->samplesperpixel;
    do {
      if (w != 0) {
        puVar2 = img->Bitdepth16To8;
        uVar3 = w;
        do {
          *cp = CONCAT12(puVar2[*(ushort *)((long)pp + 4)],
                         CONCAT11(puVar2[*(ushort *)((long)pp + 2)],puVar2[*(ushort *)pp])) |
                0xff000000;
          cp = cp + 1;
          pp = (uchar *)((long)pp + (ulong)((uint)uVar1 * 2));
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      cp = cp + toskew;
      pp = (uchar *)((long)pp + (long)fromskew * (ulong)uVar1 * 2);
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = PACK(img->Bitdepth16To8[wp[0]], img->Bitdepth16To8[wp[1]],
                         img->Bitdepth16To8[wp[2]]);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}